

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::HttpClient::openWebSocket(HttpClient *this,StringPtr url,HttpHeaders *headers)

{
  PromiseArena *pPVar1;
  long *plVar2;
  OwnPromiseNode OVar3;
  void *pvVar4;
  TransformPromiseNodeBase *this_00;
  undefined8 *local_50;
  long *local_48;
  OwnPromiseNode local_40;
  undefined1 local_38;
  
  local_38 = 0;
  (*(code *)**(undefined8 **)url.content.ptr)(&local_50,url.content.ptr,0,url.content.size_,headers)
  ;
  OVar3.ptr = local_40.ptr;
  pPVar1 = ((local_40.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_40.ptr - (long)pPVar1) < 0x28) {
    pvVar4 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_40,
               kj::_::
               SimpleTransformPromiseNode<kj::HttpClient::Response,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:5744:22)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_0061b198;
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    ((local_40.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)&local_40.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_40,
               kj::_::
               SimpleTransformPromiseNode<kj::HttpClient::Response,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:5744:22)>
               ::anon_class_1_0_00000001_for_func::operator());
    OVar3.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0061b198;
    OVar3.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  OVar3.ptr = local_40.ptr;
  this->_vptr_HttpClient = (_func_int **)this_00;
  if (&(local_40.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_40.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  plVar2 = local_48;
  if (local_48 != (long *)0x0) {
    local_48 = (long *)0x0;
    (**(code **)*local_50)(local_50,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<HttpClient::WebSocketResponse> HttpClient::openWebSocket(
    kj::StringPtr url, const HttpHeaders& headers) {
  return request(HttpMethod::GET, url, headers, kj::none)
      .response.then([](HttpClient::Response&& response) -> WebSocketResponse {
    kj::OneOf<kj::Own<kj::AsyncInputStream>, kj::Own<WebSocket>> body;
    body.init<kj::Own<kj::AsyncInputStream>>(kj::mv(response.body));

    return {
      response.statusCode,
      response.statusText,
      response.headers,
      kj::mv(body)
    };
  });
}